

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

smf_track_t * smf_find_track_with_next_event(smf_t *smf)

{
  int iVar1;
  smf_track_t *psVar2;
  int iVar3;
  int track_number;
  smf_track_t *psVar4;
  smf_track_t *psVar5;
  
  track_number = 0;
  if (smf->number_of_tracks < 1) {
    psVar5 = (smf_track_t *)0x0;
  }
  else {
    iVar3 = 0;
    psVar4 = (smf_track_t *)0x0;
    do {
      track_number = track_number + 1;
      psVar2 = smf_get_track_by_number(smf,track_number);
      if (psVar2 == (smf_track_t *)0x0) {
        __assert_fail("track",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x32b,"smf_track_t *smf_find_track_with_next_event(smf_t *)");
      }
      psVar5 = psVar4;
      iVar1 = iVar3;
      if ((psVar2->next_event_number != -1) &&
         (psVar5 = psVar2, iVar1 = psVar2->time_of_next_event,
         psVar4 != (smf_track_t *)0x0 && iVar3 <= psVar2->time_of_next_event)) {
        psVar5 = psVar4;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      psVar4 = psVar5;
    } while (track_number < smf->number_of_tracks);
  }
  return psVar5;
}

Assistant:

smf_track_t *
smf_find_track_with_next_event(smf_t *smf)
{
	int i, min_time = 0;
	smf_track_t *track = NULL, *min_time_track = NULL;

	/* Find track with event that should be played next. */
	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);

		assert(track);

		/* No more events in this track? */
		if (track->next_event_number == -1)
			continue;

		if (track->time_of_next_event < min_time || min_time_track == NULL) {
			min_time = track->time_of_next_event;
			min_time_track = track;
		}
	}

	return (min_time_track);
}